

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-stroke-builder.cpp
# Opt level: O1

void __thiscall
gepard::StrokePathBuilder::StrokePathBuilder
          (StrokePathBuilder *this,Float width,Float miterLimit,LineJoinType joinMode,
          LineCapType lineCap)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    LineAttributes::LineAttributes((LineAttributes *)((long)&this->_lines[0].next + lVar1));
    lVar1 = lVar1 + 0x90;
  } while (lVar1 != 0x1b0);
  this->_hasShapeFirstLine = false;
  this->_halfWidth = width * 0.5;
  this->_miterLimitSquared = miterLimit * miterLimit;
  this->_joinMode = joinMode;
  this->_lineCap = lineCap;
  PathData::PathData(&this->_path);
  SegmentApproximator::SegmentApproximator(&this->_segmentApproximator,0x10,1.0);
  this->_shapeFirstLine = this->_lines;
  this->_lastLine = this->_lines + 1;
  this->_currentLine = this->_lines + 2;
  this->_lines[1].next = this->_lines + 2;
  this->_lines[2].next = this->_lines + 1;
  return;
}

Assistant:

StrokePathBuilder::StrokePathBuilder(const Float width, const Float miterLimit, const LineJoinType joinMode, const LineCapType lineCap)
    : _hasShapeFirstLine(false)
    , _halfWidth(width / 2.0)
    , _miterLimitSquared(miterLimit * miterLimit)
    , _joinMode(joinMode)
    , _lineCap(lineCap)
{
    _shapeFirstLine = &_lines[0];
    _lastLine = &_lines[1];
    _currentLine = &_lines[2];
    _lastLine->next = _currentLine;
    _currentLine->next = _lastLine;
}